

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unswitch_pass.cpp
# Opt level: O0

void __thiscall spvtools::opt::anon_unknown_0::LoopUnswitch::PerformUnswitch(LoopUnswitch *this)

{
  IRContext *pIVar1;
  LoopDescriptor *pLVar2;
  DominatorTreeNode *pDVar3;
  Function *pFVar4;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> init_list;
  iterator ip;
  iterator ip_00;
  uint uVar5;
  pointer ppVar6;
  bool bVar7;
  Analysis AVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  Op OVar11;
  uint32_t false_id;
  BasicBlock *pBVar12;
  CFG *pCVar13;
  DominatorAnalysis *this_00;
  DominatorTree *this_01;
  Loop *bb_to_find;
  Instruction *pIVar14;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  reference puVar15;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> *pUVar16;
  size_type sVar17;
  vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
  *this_02;
  reference __x_00;
  Operand *pOVar18;
  uint *puVar19;
  ConstantManager *this_03;
  TypeManager *this_04;
  Constant *pCVar20;
  Instruction *pIVar21;
  reference ppVar22;
  Loop *this_05;
  reference puVar23;
  reference pvVar24;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar25;
  uint32_t local_74c;
  uint32_t local_738;
  BasicBlock *local_600;
  uint32_t local_5e4;
  reference local_5e0;
  pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*> *t;
  iterator __end4_2;
  iterator __begin4_2;
  vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_>_>
  *__range4_2;
  vector<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
  targets;
  InstructionBuilder builder;
  BasicBlock *original_loop_target;
  UptrVector *local_568;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *local_560;
  __normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
  local_558;
  __normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
  local_550;
  anon_class_40_2_6441670e local_548;
  function<void_(spvtools::opt::Instruction_*)> local_520;
  BasicBlock *local_500;
  BasicBlock *merge;
  _Node_iterator_base<unsigned_int,_false> _Stack_4f0;
  uint32_t merge_bb_id;
  iterator __end4_1;
  iterator __begin4_1;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range4_1;
  Loop *cloned_loop;
  LoopCloningResult clone_result;
  Instruction *specialisation_value;
  pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*> *specialisation_pair;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_>_>
  *__range3;
  anon_class_8_1_8991fb9c local_3a8;
  _Node_iterator_base<unsigned_int,_false> local_3a0;
  undefined1 local_398;
  uint32_t local_38c;
  undefined1 local_388 [8];
  function<bool_(unsigned_int)> is_from_original_loop;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  if_merging_blocks;
  Instruction *local_328;
  uint local_31c;
  allocator<unsigned_int> local_315;
  uint32_t i;
  iterator local_310;
  size_type local_308;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_300;
  void *local_2e8;
  allocator<unsigned_int> local_2dd;
  uint local_2dc;
  iterator local_2d8;
  size_type local_2d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2c8;
  Instruction *local_2b0;
  Instruction *local_2a8;
  Instruction *original_loop_constant_value;
  vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_>_>
  constant_branch;
  Type *cond_type;
  ConstantManager *cst_mgr;
  Instruction *condition;
  undefined1 local_268 [4];
  Op iv_opcode;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_260;
  Instruction *iv_condition;
  DominatorTreeNode *if_block_dtn;
  DominatorTreeNode *loop_pre_header_dtn;
  BasicBlock *local_240;
  function<void_(spvtools::opt::Instruction_*)> local_238;
  Loop *local_218;
  Loop *ploop_1;
  pointer local_208;
  pointer local_200;
  SmallVector<unsigned_int,_2UL> local_1f8;
  undefined1 local_1d0 [40];
  iterator local_1a8;
  IRContext *local_198;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *local_190;
  BasicBlock *local_188;
  BasicBlock *loop_pre_header;
  BasicBlock *if_block;
  pointer local_170;
  __normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>
  local_168;
  __normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>
  local_160;
  const_iterator local_158;
  DebugScope local_150;
  DominatorTreeNode *if_merge_block_dtn;
  DominatorTreeNode *loop_merge_dtn;
  Loop *ploop;
  BasicBlock *local_130;
  function<void_(unsigned_int_*)> local_128;
  BasicBlock *local_108;
  BasicBlock *p_bb;
  iterator iStack_f8;
  uint32_t pid;
  iterator __end4;
  iterator __begin4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> preds;
  function<void_(spvtools::opt::Instruction_*)> local_b0;
  undefined1 local_90 [16];
  InstructionBuilder builder_1;
  BasicBlock *loop_merge_block;
  BasicBlock *if_merge_block;
  LoopUtils loop_utils;
  DefUseManager *def_use_mgr;
  DominatorTree *dom_tree;
  CFG *cfg;
  LoopUnswitch *this_local;
  
  bVar7 = CanUnswitchLoop(this);
  if (!bVar7) {
    __assert_fail("CanUnswitchLoop() && \"Cannot unswitch if there is not constant condition\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp"
                  ,0x8c,"void spvtools::opt::(anonymous namespace)::LoopUnswitch::PerformUnswitch()"
                 );
  }
  pBVar12 = Loop::GetPreHeaderBlock(this->loop_);
  if (pBVar12 == (BasicBlock *)0x0) {
    __assert_fail("loop_->GetPreHeaderBlock() && \"This loop has no pre-header block\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp"
                  ,0x8d,"void spvtools::opt::(anonymous namespace)::LoopUnswitch::PerformUnswitch()"
                 );
  }
  bVar7 = Loop::IsLCSSA(this->loop_);
  if (!bVar7) {
    __assert_fail("loop_->IsLCSSA() && \"This loop is not in LCSSA form\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp"
                  ,0x8e,"void spvtools::opt::(anonymous namespace)::LoopUnswitch::PerformUnswitch()"
                 );
  }
  pCVar13 = IRContext::cfg(this->context_);
  this_00 = IRContext::GetDominatorAnalysis(this->context_,this->function_);
  this_01 = DominatorAnalysisBase::GetDomTree(&this_00->super_DominatorAnalysisBase);
  loop_utils.function_ = (Function *)IRContext::get_def_use_mgr(this->context_);
  LoopUtils::LoopUtils((LoopUtils *)&if_merge_block,this->context_,this->loop_);
  bb_to_find = (Loop *)Loop::GetMergeBlock(this->loop_);
  if (bb_to_find == (Loop *)0x0) {
    local_600 = (BasicBlock *)0x0;
  }
  else {
    join_0x00000010_0x00000000_ = FindBasicBlockPosition(this,(BasicBlock *)bb_to_find);
    local_600 = CreateBasicBlock(this,join_0x00000010_0x00000000_);
  }
  if (local_600 != (BasicBlock *)0x0) {
    pIVar1 = this->context_;
    AVar8 = operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
    InstructionBuilder::InstructionBuilder
              ((InstructionBuilder *)(local_90 + 8),pIVar1,local_600,AVar8);
    uVar9 = BasicBlock::id((BasicBlock *)bb_to_find);
    InstructionBuilder::AddBranch((InstructionBuilder *)(local_90 + 8),uVar9);
    BasicBlock::begin((BasicBlock *)local_90);
    pIVar14 = utils::IntrusiveList<spvtools::opt::Instruction>::
              iterator_template<spvtools::opt::Instruction>::operator*
                        ((iterator_template<spvtools::opt::Instruction> *)local_90);
    InstructionBuilder::SetInsertPoint((InstructionBuilder *)(local_90 + 8),pIVar14);
    CFG::RegisterBlock(pCVar13,local_600);
    pFVar4 = loop_utils.function_;
    pIVar14 = BasicBlock::GetLabelInst(local_600);
    analysis::DefUseManager::AnalyzeInstDef((DefUseManager *)pFVar4,pIVar14);
    preds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_600;
    std::function<void(spvtools::opt::Instruction*)>::
    function<spvtools::opt::(anonymous_namespace)::LoopUnswitch::PerformUnswitch()::_lambda(spvtools::opt::Instruction*)_1_,void>
              ((function<void(spvtools::opt::Instruction*)> *)&local_b0,
               (anon_class_24_3_425529c3 *)
               &preds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    BasicBlock::ForEachPhiInst((BasicBlock *)bb_to_find,&local_b0,false);
    std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_b0);
    uVar9 = BasicBlock::id((BasicBlock *)bb_to_find);
    __x = CFG::preds(pCVar13,uVar9);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range4,__x);
    __end4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range4);
    iStack_f8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range4);
    while (bVar7 = __gnu_cxx::operator!=(&__end4,&stack0xffffffffffffff08), bVar7) {
      puVar15 = __gnu_cxx::
                __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                ::operator*(&__end4);
      uVar9 = *puVar15;
      p_bb._4_4_ = uVar9;
      uVar10 = BasicBlock::id(local_600);
      if (uVar9 != uVar10) {
        pBVar12 = CFG::block(pCVar13,p_bb._4_4_);
        local_130 = local_600;
        ploop = bb_to_find;
        local_108 = pBVar12;
        std::function<void(unsigned_int*)>::
        function<spvtools::opt::(anonymous_namespace)::LoopUnswitch::PerformUnswitch()::_lambda(unsigned_int*)_1_,void>
                  ((function<void(unsigned_int*)> *)&local_128,(anon_class_16_2_76562860 *)&ploop);
        BasicBlock::ForEachSuccessorLabel(pBVar12,&local_128);
        std::function<void_(unsigned_int_*)>::~function(&local_128);
        uVar9 = p_bb._4_4_;
        uVar10 = BasicBlock::id(local_600);
        CFG::AddEdge(pCVar13,uVar9,uVar10);
      }
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&__end4);
    }
    uVar9 = BasicBlock::id((BasicBlock *)bb_to_find);
    CFG::RemoveNonExistingEdges(pCVar13,uVar9);
    loop_merge_dtn = (DominatorTreeNode *)Loop::GetParent(this->loop_);
    if ((Loop *)loop_merge_dtn != (Loop *)0x0) {
      Loop::AddBasicBlock((Loop *)loop_merge_dtn,local_600);
      pLVar2 = this->loop_desc_;
      uVar9 = BasicBlock::id(local_600);
      LoopDescriptor::SetBasicBlockToLoop(pLVar2,uVar9,(Loop *)loop_merge_dtn);
    }
    if_merge_block_dtn = DominatorTree::GetOrInsertNode(this_01,local_600);
    local_150 = (DebugScope)DominatorTree::GetOrInsertNode(this_01,(BasicBlock *)bb_to_find);
    if_merge_block_dtn->parent_ = *(DominatorTreeNode **)((long)local_150 + 8);
    std::
    vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
    ::push_back(&if_merge_block_dtn->children_,(value_type *)&local_150);
    std::
    vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
    ::push_back(&if_merge_block_dtn->parent_->children_,&if_merge_block_dtn);
    pDVar3 = *(DominatorTreeNode **)((long)local_150 + 8);
    local_168._M_current =
         (DominatorTreeNode **)
         std::
         vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
         ::begin(&(*(DominatorTreeNode **)((long)local_150 + 8))->children_);
    local_170 = (pointer)std::
                         vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
                         ::end(&(*(DominatorTreeNode **)((long)local_150 + 8))->children_);
    local_160 = std::
                find<__gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode**,std::vector<spvtools::opt::DominatorTreeNode*,std::allocator<spvtools::opt::DominatorTreeNode*>>>,spvtools::opt::DominatorTreeNode*>
                          (local_168,
                           (__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>
                            )local_170,(DominatorTreeNode **)&local_150);
    __gnu_cxx::
    __normal_iterator<spvtools::opt::DominatorTreeNode*const*,std::vector<spvtools::opt::DominatorTreeNode*,std::allocator<spvtools::opt::DominatorTreeNode*>>>
    ::__normal_iterator<spvtools::opt::DominatorTreeNode**>
              ((__normal_iterator<spvtools::opt::DominatorTreeNode*const*,std::vector<spvtools::opt::DominatorTreeNode*,std::allocator<spvtools::opt::DominatorTreeNode*>>>
                *)&local_158,&local_160);
    if_block = (BasicBlock *)
               std::
               vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
               ::erase(&pDVar3->children_,local_158);
    Loop::SetMergeBlock(this->loop_,local_600);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range4);
  }
  loop_pre_header = Loop::GetPreHeaderBlock(this->loop_);
  local_1a8 = FindBasicBlockPosition(this,loop_pre_header);
  pUVar16 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++(&local_1a8);
  local_198 = (IRContext *)pUVar16->container_;
  local_190 = (pUVar16->iterator_)._M_current;
  ip.container_ = pUVar16->container_;
  ip.iterator_._M_current = (pUVar16->iterator_)._M_current;
  pBVar12 = CreateBasicBlock(this,ip);
  pIVar1 = this->context_;
  local_188 = pBVar12;
  AVar8 = operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
  InstructionBuilder::InstructionBuilder((InstructionBuilder *)(local_1d0 + 8),pIVar1,pBVar12,AVar8)
  ;
  pBVar12 = Loop::GetHeaderBlock(this->loop_);
  uVar9 = BasicBlock::id(pBVar12);
  InstructionBuilder::AddBranch((InstructionBuilder *)(local_1d0 + 8),uVar9);
  BasicBlock::tail((BasicBlock *)local_1d0);
  pIVar14 = utils::IntrusiveList<spvtools::opt::Instruction>::
            iterator_template<spvtools::opt::Instruction>::operator->
                      ((iterator_template<spvtools::opt::Instruction> *)local_1d0);
  ploop_1._4_4_ = BasicBlock::id(local_188);
  local_208 = (pointer)((long)&ploop_1 + 4);
  local_200 = (pointer)0x1;
  init_list._M_len = 1;
  init_list._M_array = (iterator)local_208;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1f8,init_list);
  Instruction::SetInOperand(pIVar14,0,&local_1f8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1f8);
  local_218 = LoopDescriptor::operator[](this->loop_desc_,loop_pre_header);
  if (local_218 != (Loop *)0x0) {
    Loop::AddBasicBlock(local_218,local_188);
    pLVar2 = this->loop_desc_;
    uVar9 = BasicBlock::id(local_188);
    LoopDescriptor::SetBasicBlockToLoop(pLVar2,uVar9,local_218);
  }
  CFG::RegisterBlock(pCVar13,local_188);
  pFVar4 = loop_utils.function_;
  pIVar14 = BasicBlock::GetLabelInst(local_188);
  analysis::DefUseManager::AnalyzeInstDef((DefUseManager *)pFVar4,pIVar14);
  uVar9 = BasicBlock::id(loop_pre_header);
  uVar10 = BasicBlock::id(local_188);
  CFG::AddEdge(pCVar13,uVar9,uVar10);
  pBVar12 = Loop::GetHeaderBlock(this->loop_);
  uVar9 = BasicBlock::id(pBVar12);
  CFG::RemoveNonExistingEdges(pCVar13,uVar9);
  pBVar12 = Loop::GetHeaderBlock(this->loop_);
  loop_pre_header_dtn = (DominatorTreeNode *)local_188;
  local_240 = loop_pre_header;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::(anonymous_namespace)::LoopUnswitch::PerformUnswitch()::_lambda(spvtools::opt::Instruction*)_2_,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_238,
             (anon_class_16_2_712ef7be *)&loop_pre_header_dtn);
  BasicBlock::ForEachPhiInst(pBVar12,&local_238,false);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_238);
  Loop::SetPreHeaderBlock(this->loop_,local_188);
  if_block_dtn = DominatorTree::GetOrInsertNode(this_01,local_188);
  iv_condition = (Instruction *)DominatorTree::GetTreeNode(this_01,loop_pre_header);
  if_block_dtn->parent_ = (DominatorTreeNode *)iv_condition;
  sVar17 = std::
           vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
           ::size((vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
                   *)&(iv_condition->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                      previous_node_);
  if (sVar17 == 1) {
    this_02 = &if_block_dtn->children_;
    __x_00 = std::
             vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
             ::operator[]((vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
                           *)&(iv_condition->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                              previous_node_,0);
    std::
    vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
    ::push_back(this_02,__x_00);
    std::
    vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
    ::clear((vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
             *)&(iv_condition->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_);
    std::
    vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
    ::push_back((vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
                 *)&(iv_condition->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                    previous_node_,&if_block_dtn);
    DominatorTree::ResetDFNumbering(this_01);
    Loop::ComputeLoopStructuredOrder(this->loop_,&this->ordered_loop_blocks_,true,true);
    BasicBlock::tail((BasicBlock *)local_268);
    local_260._M_head_impl =
         utils::IntrusiveList<spvtools::opt::Instruction>::
         iterator_template<spvtools::opt::Instruction>::operator*
                   ((iterator_template<spvtools::opt::Instruction> *)local_268);
    OVar11 = Instruction::opcode(local_260._M_head_impl);
    pFVar4 = loop_utils.function_;
    pOVar18 = Instruction::GetOperand(local_260._M_head_impl,0);
    puVar19 = utils::SmallVector<unsigned_int,_2UL>::operator[](&pOVar18->words,0);
    pIVar14 = analysis::DefUseManager::GetDef((DefUseManager *)pFVar4,*puVar19);
    this_03 = IRContext::get_constant_mgr(this->context_);
    this_04 = IRContext::get_type_mgr(this->context_);
    uVar9 = Instruction::type_id(pIVar14);
    constant_branch.
    super__Vector_base<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)analysis::TypeManager::GetType(this_04,uVar9);
    std::
    vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_>_>
    ::vector((vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_>_>
              *)&original_loop_constant_value);
    ppVar6 = constant_branch.
             super__Vector_base<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (OVar11 == OpBranchConditional) {
      local_2dc = 0;
      local_2d8 = &local_2dc;
      local_2d0 = 1;
      std::allocator<unsigned_int>::allocator(&local_2dd);
      __l_00._M_len = local_2d0;
      __l_00._M_array = local_2d8;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_2c8,__l_00,&local_2dd)
      ;
      pCVar20 = analysis::ConstantManager::GetConstant(this_03,(Type *)ppVar6,&local_2c8);
      local_2b0 = analysis::ConstantManager::GetDefiningInstruction
                            (this_03,pCVar20,0,(inst_iterator *)0x0);
      local_2e8 = (void *)0x0;
      std::
      vector<std::pair<spvtools::opt::Instruction*,spvtools::opt::BasicBlock*>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::BasicBlock*>>>
      ::emplace_back<spvtools::opt::Instruction*,decltype(nullptr)>
                ((vector<std::pair<spvtools::opt::Instruction*,spvtools::opt::BasicBlock*>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::BasicBlock*>>>
                  *)&original_loop_constant_value,&local_2b0,&local_2e8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_2c8);
      std::allocator<unsigned_int>::~allocator(&local_2dd);
      ppVar6 = constant_branch.
               super__Vector_base<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      i = 1;
      local_310 = &i;
      local_308 = 1;
      std::allocator<unsigned_int>::allocator(&local_315);
      __l._M_len = local_308;
      __l._M_array = local_310;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_300,__l,&local_315);
      pCVar20 = analysis::ConstantManager::GetConstant(this_03,(Type *)ppVar6,&local_300);
      local_2a8 = analysis::ConstantManager::GetDefiningInstruction
                            (this_03,pCVar20,0,(inst_iterator *)0x0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_300);
      std::allocator<unsigned_int>::~allocator(&local_315);
    }
    else {
      local_2a8 = GetValueForDefaultPathForSwitch(this,local_260._M_head_impl);
      for (local_31c = 2; uVar5 = local_31c,
          uVar9 = Instruction::NumInOperands(local_260._M_head_impl),
          ppVar6 = constant_branch.
                   super__Vector_base<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage, uVar5 < uVar9;
          local_31c = local_31c + 2) {
        pOVar18 = Instruction::GetInOperand(local_260._M_head_impl,local_31c);
        pCVar20 = analysis::ConstantManager::
                  GetConstant<spvtools::utils::SmallVector<unsigned_int,2ul>>
                            (this_03,(Type *)ppVar6,&pOVar18->words);
        local_328 = analysis::ConstantManager::GetDefiningInstruction
                              (this_03,pCVar20,0,(inst_iterator *)0x0);
        if_merging_blocks._M_h._M_single_bucket = (__node_base_ptr)0x0;
        std::
        vector<std::pair<spvtools::opt::Instruction*,spvtools::opt::BasicBlock*>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::BasicBlock*>>>
        ::emplace_back<spvtools::opt::Instruction*,decltype(nullptr)>
                  ((vector<std::pair<spvtools::opt::Instruction*,spvtools::opt::BasicBlock*>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::BasicBlock*>>>
                    *)&original_loop_constant_value,&local_328,
                   &if_merging_blocks._M_h._M_single_bucket);
      }
    }
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&is_from_original_loop._M_invoker);
    std::function<bool_(unsigned_int)>::function((function<bool_(unsigned_int)> *)local_388);
    pBVar12 = Loop::GetHeaderBlock(this->loop_);
    pIVar21 = BasicBlock::GetLoopMergeInst(pBVar12);
    if (pIVar21 == (Instruction *)0x0) {
      Loop::GetExitBlocks(this->loop_,
                          (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)&is_from_original_loop._M_invoker);
      __range3 = (vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_>_>
                  *)this;
      std::function<bool(unsigned_int)>::operator=
                ((function<bool(unsigned_int)> *)local_388,(anon_class_8_1_8991fb9c *)&__range3);
    }
    else {
      local_38c = BasicBlock::id((BasicBlock *)bb_to_find);
      pVar25 = std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)&is_from_original_loop._M_invoker,&local_38c);
      local_3a0._M_cur =
           (__node_type *)pVar25.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_398 = pVar25.second;
      local_3a8.this = this;
      std::function<bool(unsigned_int)>::operator=
                ((function<bool(unsigned_int)> *)local_388,&local_3a8);
    }
    __end3 = std::
             vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_>_>
             ::begin((vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_>_>
                      *)&original_loop_constant_value);
    specialisation_pair =
         (pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*> *)
         std::
         vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_>_>
         ::end((vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_>_>
                *)&original_loop_constant_value);
    while (bVar7 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_*,_std::vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_>_>_>
                                       *)&specialisation_pair), bVar7) {
      ppVar22 = __gnu_cxx::
                __normal_iterator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_*,_std::vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_>_>_>
                ::operator*(&__end3);
      clone_result.cloned_bb_.
      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ppVar22->first;
      LoopUtils::LoopCloningResult::LoopCloningResult((LoopCloningResult *)&cloned_loop);
      this_05 = LoopUtils::CloneLoop
                          ((LoopUtils *)&if_merge_block,(LoopCloningResult *)&cloned_loop,
                           &this->ordered_loop_blocks_);
      pBVar12 = Loop::GetPreHeaderBlock(this_05);
      ppVar22->second = pBVar12;
      SpecializeLoop(this,this_05,pIVar14,
                     (Instruction *)
                     clone_result.cloned_bb_.
                     super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __end4_1 = std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::begin((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&is_from_original_loop._M_invoker);
      _Stack_4f0._M_cur =
           (__node_type *)
           std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)&is_from_original_loop._M_invoker);
      while (bVar7 = std::__detail::operator!=
                               (&__end4_1.super__Node_iterator_base<unsigned_int,_false>,
                                &stack0xfffffffffffffb10), bVar7) {
        puVar23 = std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*(&__end4_1);
        merge._4_4_ = *puVar23;
        pCVar13 = IRContext::cfg(this->context_);
        pBVar12 = CFG::block(pCVar13,merge._4_4_);
        local_500 = pBVar12;
        std::function<bool_(unsigned_int)>::function
                  (&local_548.is_from_original_loop,(function<bool_(unsigned_int)> *)local_388);
        local_548.clone_result = (LoopCloningResult *)&cloned_loop;
        std::function<void(spvtools::opt::Instruction*)>::
        function<spvtools::opt::(anonymous_namespace)::LoopUnswitch::PerformUnswitch()::_lambda(spvtools::opt::Instruction*)_3_,void>
                  ((function<void(spvtools::opt::Instruction*)> *)&local_520,&local_548);
        BasicBlock::ForEachPhiInst(pBVar12,&local_520,false);
        std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_520);
        (anonymous_namespace)::LoopUnswitch::PerformUnswitch()::
        {lambda(spvtools::opt::Instruction*)#3}::~Instruction
                  ((_lambda_spvtools__opt__Instruction___3_ *)&local_548);
        std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(&__end4_1);
      }
      pFVar4 = this->function_;
      local_550._M_current =
           (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *
           )std::
            vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ::begin((vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                     *)&clone_result.new_to_old_bb_._M_h._M_single_bucket);
      local_558._M_current =
           (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *
           )std::
            vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ::end((vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                   *)&clone_result.new_to_old_bb_._M_h._M_single_bucket);
      _original_loop_target = FindBasicBlockPosition(this,loop_pre_header);
      pUVar16 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
                          ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)
                           &original_loop_target);
      local_568 = pUVar16->container_;
      local_560 = (pUVar16->iterator_)._M_current;
      ip_00.container_ = pUVar16->container_;
      ip_00.iterator_._M_current = (pUVar16->iterator_)._M_current;
      Function::
      AddBasicBlocks<__gnu_cxx::__normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>*,std::vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>>>
                (pFVar4,local_550,local_558,ip_00);
      LoopUtils::LoopCloningResult::~LoopCloningResult((LoopCloningResult *)&cloned_loop);
      __gnu_cxx::
      __normal_iterator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_*,_std::vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_>_>_>
      ::operator++(&__end3);
    }
    SpecializeLoop(this,this->loop_,pIVar14,local_2a8);
    pBVar12 = Loop::GetPreHeaderBlock(this->loop_);
    pIVar1 = this->context_;
    BasicBlock::tail((BasicBlock *)&builder.preserved_analyses_);
    pIVar21 = utils::IntrusiveList<spvtools::opt::Instruction>::
              iterator_template<spvtools::opt::Instruction>::operator*
                        ((iterator_template<spvtools::opt::Instruction> *)
                         &builder.preserved_analyses_);
    IRContext::KillInst(pIVar1,pIVar21);
    InstructionBuilder::InstructionBuilder
              ((InstructionBuilder *)
               &targets.
                super__Vector_base<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,this->context_,loop_pre_header,
               kAnalysisNone);
    if (OVar11 == OpBranchConditional) {
      sVar17 = std::
               vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_>_>
               ::size((vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_>_>
                       *)&original_loop_constant_value);
      if (sVar17 != 1) {
        __assert_fail("constant_branch.size() == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp"
                      ,0x18e,
                      "void spvtools::opt::(anonymous namespace)::LoopUnswitch::PerformUnswitch()");
      }
      uVar9 = Instruction::result_id(pIVar14);
      uVar10 = BasicBlock::id(pBVar12);
      pvVar24 = std::
                vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_>_>
                ::operator[]((vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_>_>
                              *)&original_loop_constant_value,0);
      false_id = BasicBlock::id(pvVar24->second);
      if (bb_to_find == (Loop *)0x0) {
        local_738 = 0xffffffff;
      }
      else {
        local_738 = BasicBlock::id((BasicBlock *)bb_to_find);
      }
      InstructionBuilder::AddConditionalBranch
                ((InstructionBuilder *)
                 &targets.
                  super__Vector_base<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar9,uVar10,false_id,local_738
                 ,0);
    }
    else {
      std::
      vector<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
      ::vector((vector<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
                *)&__range4_2);
      __end4_2 = std::
                 vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_>_>
                 ::begin((vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_>_>
                          *)&original_loop_constant_value);
      t = (pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*> *)
          std::
          vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_>_>
          ::end((vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_>_>
                 *)&original_loop_constant_value);
      while (bVar7 = __gnu_cxx::operator!=
                               (&__end4_2,
                                (__normal_iterator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_*,_std::vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_>_>_>
                                 *)&t), bVar7) {
        local_5e0 = __gnu_cxx::
                    __normal_iterator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_*,_std::vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_>_>_>
                    ::operator*(&__end4_2);
        pOVar18 = Instruction::GetInOperand(local_5e0->first,0);
        local_5e4 = BasicBlock::id(local_5e0->second);
        std::
        vector<std::pair<spvtools::utils::SmallVector<unsigned_int,2ul>,unsigned_int>,std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,2ul>,unsigned_int>>>
        ::emplace_back<spvtools::utils::SmallVector<unsigned_int,2ul>&,unsigned_int>
                  ((vector<std::pair<spvtools::utils::SmallVector<unsigned_int,2ul>,unsigned_int>,std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,2ul>,unsigned_int>>>
                    *)&__range4_2,&pOVar18->words,&local_5e4);
        __gnu_cxx::
        __normal_iterator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_*,_std::vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_>_>_>
        ::operator++(&__end4_2);
      }
      uVar9 = Instruction::result_id(pIVar14);
      uVar10 = BasicBlock::id(pBVar12);
      if (bb_to_find == (Loop *)0x0) {
        local_74c = 0xffffffff;
      }
      else {
        local_74c = BasicBlock::id((BasicBlock *)bb_to_find);
      }
      InstructionBuilder::AddSwitch
                ((InstructionBuilder *)
                 &targets.
                  super__Vector_base<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar9,uVar10,
                 (vector<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
                  *)&__range4_2,local_74c,0);
      std::
      vector<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
      ::~vector((vector<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
                 *)&__range4_2);
    }
    this->switch_block_ = (BasicBlock *)0x0;
    std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::clear
              (&this->ordered_loop_blocks_);
    IRContext::InvalidateAnalysesExceptFor(this->context_,kAnalysisLoopAnalysis);
    std::function<bool_(unsigned_int)>::~function((function<bool_(unsigned_int)> *)local_388);
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)&is_from_original_loop._M_invoker);
    std::
    vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_>_>
    ::~vector((vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*>_>_>
               *)&original_loop_constant_value);
    return;
  }
  __assert_fail("if_block_dtn->children_.size() == 1 && \"A loop preheader should only have the header block as a child in the \" \"dominator tree\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp"
                ,0x10b,"void spvtools::opt::(anonymous namespace)::LoopUnswitch::PerformUnswitch()")
  ;
}

Assistant:

void PerformUnswitch() {
    assert(CanUnswitchLoop() &&
           "Cannot unswitch if there is not constant condition");
    assert(loop_->GetPreHeaderBlock() && "This loop has no pre-header block");
    assert(loop_->IsLCSSA() && "This loop is not in LCSSA form");

    CFG& cfg = *context_->cfg();
    DominatorTree* dom_tree =
        &context_->GetDominatorAnalysis(function_)->GetDomTree();
    analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();
    LoopUtils loop_utils(context_, loop_);

    //////////////////////////////////////////////////////////////////////////////
    // Step 1: Create the if merge block for structured modules.
    //    To do so, the |loop_| merge block will become the if's one and we
    //    create a merge for the loop. This will limit the amount of duplicated
    //    code the structured control flow imposes.
    //    For non structured program, the new loop will be connected to
    //    the old loop's exit blocks.
    //////////////////////////////////////////////////////////////////////////////

    // Get the merge block if it exists.
    BasicBlock* if_merge_block = loop_->GetMergeBlock();
    // The merge block is only created if the loop has a unique exit block. We
    // have this guarantee for structured loops, for compute loop it will
    // trivially help maintain both a structured-like form and LCSAA.
    BasicBlock* loop_merge_block =
        if_merge_block
            ? CreateBasicBlock(FindBasicBlockPosition(if_merge_block))
            : nullptr;
    if (loop_merge_block) {
      // Add the instruction and update managers.
      InstructionBuilder builder(
          context_, loop_merge_block,
          IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
      builder.AddBranch(if_merge_block->id());
      builder.SetInsertPoint(&*loop_merge_block->begin());
      cfg.RegisterBlock(loop_merge_block);
      def_use_mgr->AnalyzeInstDef(loop_merge_block->GetLabelInst());
      // Update CFG.
      if_merge_block->ForEachPhiInst(
          [loop_merge_block, &builder, this](Instruction* phi) {
            Instruction* cloned = phi->Clone(context_);
            cloned->SetResultId(TakeNextId());
            builder.AddInstruction(std::unique_ptr<Instruction>(cloned));
            phi->SetInOperand(0, {cloned->result_id()});
            phi->SetInOperand(1, {loop_merge_block->id()});
            for (uint32_t j = phi->NumInOperands() - 1; j > 1; j--)
              phi->RemoveInOperand(j);
          });
      // Copy the predecessor list (will get invalidated otherwise).
      std::vector<uint32_t> preds = cfg.preds(if_merge_block->id());
      for (uint32_t pid : preds) {
        if (pid == loop_merge_block->id()) continue;
        BasicBlock* p_bb = cfg.block(pid);
        p_bb->ForEachSuccessorLabel(
            [if_merge_block, loop_merge_block](uint32_t* id) {
              if (*id == if_merge_block->id()) *id = loop_merge_block->id();
            });
        cfg.AddEdge(pid, loop_merge_block->id());
      }
      cfg.RemoveNonExistingEdges(if_merge_block->id());
      // Update loop descriptor.
      if (Loop* ploop = loop_->GetParent()) {
        ploop->AddBasicBlock(loop_merge_block);
        loop_desc_.SetBasicBlockToLoop(loop_merge_block->id(), ploop);
      }
      // Update the dominator tree.
      DominatorTreeNode* loop_merge_dtn =
          dom_tree->GetOrInsertNode(loop_merge_block);
      DominatorTreeNode* if_merge_block_dtn =
          dom_tree->GetOrInsertNode(if_merge_block);
      loop_merge_dtn->parent_ = if_merge_block_dtn->parent_;
      loop_merge_dtn->children_.push_back(if_merge_block_dtn);
      loop_merge_dtn->parent_->children_.push_back(loop_merge_dtn);
      if_merge_block_dtn->parent_->children_.erase(std::find(
          if_merge_block_dtn->parent_->children_.begin(),
          if_merge_block_dtn->parent_->children_.end(), if_merge_block_dtn));

      loop_->SetMergeBlock(loop_merge_block);
    }

    ////////////////////////////////////////////////////////////////////////////
    // Step 2: Build a new preheader for |loop_|, use the old one
    //         for the invariant branch.
    ////////////////////////////////////////////////////////////////////////////

    BasicBlock* if_block = loop_->GetPreHeaderBlock();
    // If this preheader is the parent loop header,
    // we need to create a dedicated block for the if.
    BasicBlock* loop_pre_header =
        CreateBasicBlock(++FindBasicBlockPosition(if_block));
    InstructionBuilder(
        context_, loop_pre_header,
        IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping)
        .AddBranch(loop_->GetHeaderBlock()->id());

    if_block->tail()->SetInOperand(0, {loop_pre_header->id()});

    // Update loop descriptor.
    if (Loop* ploop = loop_desc_[if_block]) {
      ploop->AddBasicBlock(loop_pre_header);
      loop_desc_.SetBasicBlockToLoop(loop_pre_header->id(), ploop);
    }

    // Update the CFG.
    cfg.RegisterBlock(loop_pre_header);
    def_use_mgr->AnalyzeInstDef(loop_pre_header->GetLabelInst());
    cfg.AddEdge(if_block->id(), loop_pre_header->id());
    cfg.RemoveNonExistingEdges(loop_->GetHeaderBlock()->id());

    loop_->GetHeaderBlock()->ForEachPhiInst(
        [loop_pre_header, if_block](Instruction* phi) {
          phi->ForEachInId([loop_pre_header, if_block](uint32_t* id) {
            if (*id == if_block->id()) {
              *id = loop_pre_header->id();
            }
          });
        });
    loop_->SetPreHeaderBlock(loop_pre_header);

    // Update the dominator tree.
    DominatorTreeNode* loop_pre_header_dtn =
        dom_tree->GetOrInsertNode(loop_pre_header);
    DominatorTreeNode* if_block_dtn = dom_tree->GetTreeNode(if_block);
    loop_pre_header_dtn->parent_ = if_block_dtn;
    assert(
        if_block_dtn->children_.size() == 1 &&
        "A loop preheader should only have the header block as a child in the "
        "dominator tree");
    loop_pre_header_dtn->children_.push_back(if_block_dtn->children_[0]);
    if_block_dtn->children_.clear();
    if_block_dtn->children_.push_back(loop_pre_header_dtn);

    // Make domination queries valid.
    dom_tree->ResetDFNumbering();

    // Compute an ordered list of basic block to clone: loop blocks + pre-header
    // + merge block.
    loop_->ComputeLoopStructuredOrder(&ordered_loop_blocks_, true, true);

    /////////////////////////////
    // Do the actual unswitch: //
    //   - Clone the loop      //
    //   - Connect exits       //
    //   - Specialize the loop //
    /////////////////////////////

    Instruction* iv_condition = &*switch_block_->tail();
    spv::Op iv_opcode = iv_condition->opcode();
    Instruction* condition =
        def_use_mgr->GetDef(iv_condition->GetOperand(0).words[0]);

    analysis::ConstantManager* cst_mgr = context_->get_constant_mgr();
    const analysis::Type* cond_type =
        context_->get_type_mgr()->GetType(condition->type_id());

    // Build the list of value for which we need to clone and specialize the
    // loop.
    std::vector<std::pair<Instruction*, BasicBlock*>> constant_branch;
    // Special case for the original loop
    Instruction* original_loop_constant_value;
    if (iv_opcode == spv::Op::OpBranchConditional) {
      constant_branch.emplace_back(
          cst_mgr->GetDefiningInstruction(cst_mgr->GetConstant(cond_type, {0})),
          nullptr);
      original_loop_constant_value =
          cst_mgr->GetDefiningInstruction(cst_mgr->GetConstant(cond_type, {1}));
    } else {
      // We are looking to take the default branch, so we can't provide a
      // specific value.
      original_loop_constant_value =
          GetValueForDefaultPathForSwitch(iv_condition);

      for (uint32_t i = 2; i < iv_condition->NumInOperands(); i += 2) {
        constant_branch.emplace_back(
            cst_mgr->GetDefiningInstruction(cst_mgr->GetConstant(
                cond_type, iv_condition->GetInOperand(i).words)),
            nullptr);
      }
    }

    // Get the loop landing pads.
    std::unordered_set<uint32_t> if_merging_blocks;
    std::function<bool(uint32_t)> is_from_original_loop;
    if (loop_->GetHeaderBlock()->GetLoopMergeInst()) {
      if_merging_blocks.insert(if_merge_block->id());
      is_from_original_loop = [this](uint32_t id) {
        return loop_->IsInsideLoop(id) || loop_->GetMergeBlock()->id() == id;
      };
    } else {
      loop_->GetExitBlocks(&if_merging_blocks);
      is_from_original_loop = [this](uint32_t id) {
        return loop_->IsInsideLoop(id);
      };
    }

    for (auto& specialisation_pair : constant_branch) {
      Instruction* specialisation_value = specialisation_pair.first;
      //////////////////////////////////////////////////////////
      // Step 3: Duplicate |loop_|.
      //////////////////////////////////////////////////////////
      LoopUtils::LoopCloningResult clone_result;

      Loop* cloned_loop =
          loop_utils.CloneLoop(&clone_result, ordered_loop_blocks_);
      specialisation_pair.second = cloned_loop->GetPreHeaderBlock();

      ////////////////////////////////////
      // Step 4: Specialize the loop.   //
      ////////////////////////////////////

      {
        SpecializeLoop(cloned_loop, condition, specialisation_value);

        ///////////////////////////////////////////////////////////
        // Step 5: Connect convergent edges to the landing pads. //
        ///////////////////////////////////////////////////////////

        for (uint32_t merge_bb_id : if_merging_blocks) {
          BasicBlock* merge = context_->cfg()->block(merge_bb_id);
          // We are in LCSSA so we only care about phi instructions.
          merge->ForEachPhiInst(
              [is_from_original_loop, &clone_result](Instruction* phi) {
                uint32_t num_in_operands = phi->NumInOperands();
                for (uint32_t i = 0; i < num_in_operands; i += 2) {
                  uint32_t pred = phi->GetSingleWordInOperand(i + 1);
                  if (is_from_original_loop(pred)) {
                    pred = clone_result.value_map_.at(pred);
                    uint32_t incoming_value_id = phi->GetSingleWordInOperand(i);
                    // Not all the incoming values are coming from the loop.
                    ValueMapTy::iterator new_value =
                        clone_result.value_map_.find(incoming_value_id);
                    if (new_value != clone_result.value_map_.end()) {
                      incoming_value_id = new_value->second;
                    }
                    phi->AddOperand({SPV_OPERAND_TYPE_ID, {incoming_value_id}});
                    phi->AddOperand({SPV_OPERAND_TYPE_ID, {pred}});
                  }
                }
              });
        }
      }
      function_->AddBasicBlocks(clone_result.cloned_bb_.begin(),
                                clone_result.cloned_bb_.end(),
                                ++FindBasicBlockPosition(if_block));
    }

    // Specialize the existing loop.
    SpecializeLoop(loop_, condition, original_loop_constant_value);
    BasicBlock* original_loop_target = loop_->GetPreHeaderBlock();

    /////////////////////////////////////
    // Finally: connect the new loops. //
    /////////////////////////////////////

    // Delete the old jump
    context_->KillInst(&*if_block->tail());
    InstructionBuilder builder(context_, if_block);
    if (iv_opcode == spv::Op::OpBranchConditional) {
      assert(constant_branch.size() == 1);
      builder.AddConditionalBranch(
          condition->result_id(), original_loop_target->id(),
          constant_branch[0].second->id(),
          if_merge_block ? if_merge_block->id() : kInvalidId);
    } else {
      std::vector<std::pair<Operand::OperandData, uint32_t>> targets;
      for (auto& t : constant_branch) {
        targets.emplace_back(t.first->GetInOperand(0).words, t.second->id());
      }

      builder.AddSwitch(condition->result_id(), original_loop_target->id(),
                        targets,
                        if_merge_block ? if_merge_block->id() : kInvalidId);
    }

    switch_block_ = nullptr;
    ordered_loop_blocks_.clear();

    context_->InvalidateAnalysesExceptFor(
        IRContext::Analysis::kAnalysisLoopAnalysis);
  }